

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUInteger.cpp
# Opt level: O3

filepos_t __thiscall
libebml::EbmlUInteger::RenderData(EbmlUInteger *this,IOCallback *output,bool param_2,bool param_3)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined7 in_register_00000011;
  uint uVar2;
  ulong uVar3;
  uint64 uVar4;
  binary FinalData [8];
  undefined1 local_30 [8];
  
  if (8 < (this->super_EbmlElement).SizeLength) {
    return 0;
  }
  uVar4 = this->Value;
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])
                    (this,output,CONCAT71(in_register_00000011,param_2));
  if (CONCAT44(extraout_var,iVar1) != 0) {
    uVar2 = 1;
    uVar3 = 0;
    do {
      iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
      local_30[~uVar3 + CONCAT44(extraout_var_00,iVar1)] = (char)uVar4;
      uVar4 = uVar4 >> 8;
      uVar3 = (ulong)uVar2;
      iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
      uVar2 = uVar2 + 1;
    } while (uVar3 < CONCAT44(extraout_var_01,iVar1));
  }
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  IOCallback::writeFully(output,local_30,CONCAT44(extraout_var_02,iVar1));
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  return CONCAT44(extraout_var_03,iVar1);
}

Assistant:

filepos_t EbmlUInteger::RenderData(IOCallback & output, bool /* bForceRender */, bool /* bWithDefault */)
{
  binary FinalData[8]; // we don't handle more than 64 bits integers

  if (GetSizeLength() > 8)
    return 0; // integer bigger coded on more than 64 bits are not supported

  uint64 TempValue = Value;
  for (unsigned int i=0; i<GetSize();i++) {
    FinalData[GetSize()-i-1] = TempValue & 0xFF;
    TempValue >>= 8;
  }

  output.writeFully(FinalData,GetSize());

  return GetSize();
}